

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                 *)0x1f165fa);
  vVar2 = FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
          ::val((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                 *)0x1f1660d);
  return vVar1 * vVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}